

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall
capnp::SchemaLoader::Validator::validateTypeId(Validator *this,uint64_t id,Which expectedKind)

{
  RawSchema *pRVar1;
  Impl *this_00;
  CapTableReader *pCVar2;
  Maybe<capnp::_::RawSchema_*const_&> MVar3;
  SegmentReader *pSVar4;
  char (*in_R8) [2];
  StringPtr name;
  undefined1 local_a4 [4];
  Fault f;
  uint64_t id_local;
  uint local_8c;
  Reader node;
  ArrayPtr<const_char> local_58;
  WirePointer *local_48;
  int local_40;
  
  id_local = id;
  node._reader.segment = (SegmentReader *)id;
  MVar3 = kj::HashMap<unsigned_long,capnp::_::RawSchema*>::find<unsigned_long&>
                    ((HashMap<unsigned_long,capnp::_::RawSchema*> *)&this->loader->schemas,
                     (unsigned_long *)&node);
  if ((MVar3.ptr == (RawSchema **)0x0) || (pRVar1 = *MVar3.ptr, pRVar1 == (RawSchema *)0x0)) {
    this_00 = this->loader;
    kj::str<char_const(&)[23],capnp::Text::Reader&,char_const(&)[2]>
              ((String *)&node,(kj *)"(unknown type used by ",(char (*) [23])&this->nodeName,
               (Reader *)0x4d3f70,in_R8);
    pSVar4 = node._reader.segment;
    if (node._reader.capTable == (CapTableReader *)0x0) {
      pSVar4 = (SegmentReader *)0x4f5114;
    }
    name.content.size_ =
         (long)&(node._reader.capTable)->_vptr_CapTableReader +
         (ulong)(node._reader.capTable == (CapTableReader *)0x0);
    name.content.ptr = (char *)pSVar4;
    local_58.size_ = (size_t)SchemaLoader::Impl::loadEmpty(this_00,id,name,expectedKind,true);
    local_58.ptr = (char *)id;
    f.exception = (Exception *)local_a4;
    kj::
    Table<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::TreeIndex<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
    ::
    upsert<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::upsert<capnp::SchemaLoader::Validator::validateTypeId(unsigned_long,capnp::schema::Node::Which)::_lambda(auto:1&,auto:2&&)_2_>(unsigned_long,capnp::_::RawSchema*,capnp::SchemaLoader::Validator::validateTypeId(unsigned_long,capnp::schema::Node::Which)::_lambda(auto:1&,auto:2&&)_2_&&)::_lambda(kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry&,kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry&&)_1_>
              ((Table<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::TreeIndex<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
                *)&this->dependencies,(Entry *)&local_58,(anon_class_8_1_6f242a07 *)&f);
    pCVar2 = node._reader.capTable;
    pSVar4 = node._reader.segment;
    if (node._reader.segment == (SegmentReader *)0x0) {
      return;
    }
    node._reader.segment = (SegmentReader *)0x0;
    node._reader.capTable = (CapTableReader *)0x0;
    (*(code *)**node._reader.data)(node._reader.data,pSVar4,1,pCVar2,pCVar2,0);
    return;
  }
  local_48 = (WirePointer *)pRVar1->encodedNode;
  local_58 = (ArrayPtr<const_char>)ZEXT816(0);
  local_40 = 0x7fffffff;
  capnp::_::PointerReader::getStruct(&node._reader,(PointerReader *)&local_58,(word *)0x0);
  if (node._reader.dataSize < 0x70) {
    if (expectedKind == FILE) {
LAB_003efbc7:
      local_58.size_ = (size_t)pRVar1;
      local_58.ptr = (char *)id;
      f.exception = (Exception *)local_a4;
      kj::
      Table<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::TreeIndex<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
      ::
      upsert<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::upsert<capnp::SchemaLoader::Validator::validateTypeId(unsigned_long,capnp::schema::Node::Which)::_lambda(auto:1&,auto:2&&)_1_>(unsigned_long,capnp::_::RawSchema*,capnp::SchemaLoader::Validator::validateTypeId(unsigned_long,capnp::schema::Node::Which)::_lambda(auto:1&,auto:2&&)_1_&&)::_lambda(kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry&,kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry&&)_1_>
                ((Table<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::TreeIndex<kj::TreeMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
                  *)&this->dependencies,(Entry *)&local_58,(anon_class_8_1_6f242a07 *)&f);
      return;
    }
    local_8c = 0;
  }
  else {
    local_8c = (uint)*(Which *)((long)node._reader.data + 0xc);
    if (*(Which *)((long)node._reader.data + 0xc) == expectedKind) goto LAB_003efbc7;
  }
  local_a4._2_2_ = 0;
  local_a4._0_2_ = expectedKind;
  local_58 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&node);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,char_const(&)[46],unsigned_long&,unsigned_int,unsigned_int,capnp::Text::Reader>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
             ,0x25d,FAILED,"node.which() == expectedKind",
             "\"expected a different kind of node for this ID\", id, (uint)expectedKind, (uint)node.which(), node.getDisplayName()"
             ,(char (*) [46])"expected a different kind of node for this ID",&id_local,
             (uint *)local_a4,&stack0xffffffffffffff74,(Reader *)&local_58);
  this->isValid = false;
  kj::_::Debug::Fault::~Fault(&f);
  return;
}

Assistant:

void validateTypeId(uint64_t id, schema::Node::Which expectedKind) {
    _::RawSchema* existing = loader.tryGet(id).schema;
    if (existing != nullptr) {
      auto node = readMessageUnchecked<schema::Node>(existing->encodedNode);
      VALIDATE_SCHEMA(node.which() == expectedKind,
          "expected a different kind of node for this ID",
          id, (uint)expectedKind, (uint)node.which(), node.getDisplayName());
      dependencies.upsert(id, existing, [](auto&,auto&&) { /* ignore dupe */ });
      return;
    }

    dependencies.upsert(id, loader.loadEmpty(
        id, kj::str("(unknown type used by ", nodeName , ")"), expectedKind, true),
        [](auto&,auto&&) { /* ignore dupe */ });
  }